

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O2

MPP_RET mpp_enc_proc_tune_cfg(MppEncFineTuneCfg *dst,MppEncFineTuneCfg *src)

{
  uint uVar1;
  MppEncSceneMode MVar2;
  uint uVar3;
  long lVar4;
  MPP_RET MVar5;
  MppEncFineTuneCfg *pMVar6;
  MppEncFineTuneCfg *pMVar7;
  byte bVar8;
  MppEncFineTuneCfg bak;
  
  bVar8 = 0;
  uVar1 = src->change;
  if (uVar1 == 0) {
    MVar5 = MPP_OK;
  }
  else {
    pMVar6 = dst;
    pMVar7 = &bak;
    for (lVar4 = 0x1b; lVar4 != 0; lVar4 = lVar4 + -1) {
      pMVar7->change = pMVar6->change;
      pMVar6 = (MppEncFineTuneCfg *)&pMVar6->scene_mode;
      pMVar7 = (MppEncFineTuneCfg *)&pMVar7->scene_mode;
    }
    if ((uVar1 & 1) == 0) {
      MVar2 = dst->scene_mode;
    }
    else {
      MVar2 = src->scene_mode;
      dst->scene_mode = MVar2;
    }
    MVar5 = MPP_OK;
    if (MPP_ENC_SCENE_MODE_IPC_PTZ < MVar2) {
      _mpp_log_l(2,"mpp_enc","invalid scene mode %d not in range [%d, %d]\n",(char *)0x0,
                 (ulong)MVar2,0,2);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 2) != 0) {
      dst->deblur_en = src->deblur_en;
    }
    if ((uVar1 & 4) == 0) {
      uVar3 = dst->deblur_str;
    }
    else {
      uVar3 = src->deblur_str;
      dst->deblur_str = uVar3;
    }
    if (7 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid deblur strength not in range [0, 7]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 8) == 0) {
      uVar3 = dst->anti_flicker_str;
    }
    else {
      uVar3 = src->anti_flicker_str;
      dst->anti_flicker_str = uVar3;
    }
    if (3 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid anti_flicker_str not in range [0 : 3]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((char)uVar1 < '\0') {
      uVar3 = src->atr_str_i;
      dst->atr_str_i = uVar3;
    }
    else {
      uVar3 = dst->atr_str_i;
    }
    if (3 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      uVar3 = dst->atr_str_p;
    }
    else {
      uVar3 = src->atr_str_p;
      dst->atr_str_p = uVar3;
    }
    if (3 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 9 & 1) == 0) {
      uVar3 = dst->atl_str;
    }
    else {
      uVar3 = src->atl_str;
      dst->atl_str = uVar3;
    }
    if (3 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      uVar3 = dst->sao_str_i;
    }
    else {
      uVar3 = src->sao_str_i;
      dst->sao_str_i = uVar3;
    }
    if (3 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar3 = dst->sao_str_p;
    }
    else {
      uVar3 = src->sao_str_p;
      dst->sao_str_p = uVar3;
    }
    if (3 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 0x20) == 0) {
      uVar3 = dst->lambda_idx_i;
    }
    else {
      uVar3 = src->lambda_idx_i;
      dst->lambda_idx_i = uVar3;
    }
    if (8 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid lambda idx i not in range [0, 8]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 0x40) == 0) {
      uVar3 = dst->lambda_idx_p;
    }
    else {
      uVar3 = src->lambda_idx_p;
      dst->lambda_idx_p = uVar3;
    }
    if (8 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid lambda idx i not in range [0, 8]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 0xd & 1) == 0) {
      uVar3 = dst->rc_container;
    }
    else {
      uVar3 = src->rc_container;
      dst->rc_container = uVar3;
    }
    if (2 < uVar3) {
      _mpp_log_l(2,"mpp_enc","invalid rc_container %d not in range [0, 2]\n",(char *)0x0);
      MVar5 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 0xe & 1) == 0) {
      uVar3 = dst->vmaf_opt;
    }
    else {
      uVar3 = src->vmaf_opt;
      dst->vmaf_opt = uVar3;
    }
    if (1 < uVar3) {
      MVar5 = MPP_ERR_VALUE;
      _mpp_log_l(2,"mpp_enc","invalid vmaf_opt %d not in range [0, 1]\n",(char *)0x0);
    }
    dst->change = dst->change | uVar1;
    if (MVar5 != MPP_OK) {
      _mpp_log_l(2,"mpp_enc","failed to accept new tuning config\n","mpp_enc_proc_tune_cfg");
      pMVar6 = &bak;
      for (lVar4 = 0x1b; lVar4 != 0; lVar4 = lVar4 + -1) {
        dst->change = pMVar6->change;
        pMVar6 = (MppEncFineTuneCfg *)((long)pMVar6 + (ulong)bVar8 * -8 + 4);
        dst = (MppEncFineTuneCfg *)((long)dst + (ulong)bVar8 * -8 + 4);
      }
    }
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_enc_proc_tune_cfg(MppEncFineTuneCfg *dst, MppEncFineTuneCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncFineTuneCfg bak = *dst;

        if (change & MPP_ENC_TUNE_CFG_CHANGE_SCENE_MODE)
            dst->scene_mode = src->scene_mode;

        if (dst->scene_mode < MPP_ENC_SCENE_MODE_DEFAULT ||
            dst->scene_mode >= MPP_ENC_SCENE_MODE_BUTT) {
            mpp_err("invalid scene mode %d not in range [%d, %d]\n", dst->scene_mode,
                    MPP_ENC_SCENE_MODE_DEFAULT, MPP_ENC_SCENE_MODE_BUTT - 1);
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_DEBLUR_EN)
            dst->deblur_en = src->deblur_en;

        if (change & MPP_ENC_TUNE_CFG_CHANGE_DEBLUR_STR)
            dst->deblur_str = src->deblur_str;

        if (dst->deblur_str < 0 || dst->deblur_str > 7) {
            mpp_err("invalid deblur strength not in range [0, 7]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ANTI_FLICKER_STR)
            dst->anti_flicker_str = src->anti_flicker_str;

        if (dst->anti_flicker_str < 0 || dst->anti_flicker_str > 3) {
            mpp_err("invalid anti_flicker_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ATR_STR_I)
            dst->atr_str_i = src->atr_str_i;

        if (dst->atr_str_i < 0 || dst->atr_str_i > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ATR_STR_P)
            dst->atr_str_p = src->atr_str_p;

        if (dst->atr_str_p < 0 || dst->atr_str_p > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ATL_STR)
            dst->atl_str = src->atl_str;

        if (dst->atl_str < 0 || dst->atl_str > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_SAO_STR_I)
            dst->sao_str_i = src->sao_str_i;

        if (dst->sao_str_i < 0 || dst->sao_str_i > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_SAO_STR_P)
            dst->sao_str_p = src->sao_str_p;

        if (dst->sao_str_p < 0 || dst->sao_str_p > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_LAMBDA_IDX_I)
            dst->lambda_idx_i = src->lambda_idx_i;

        if (dst->lambda_idx_i < 0 || dst->lambda_idx_i > 8) {
            mpp_err("invalid lambda idx i not in range [0, 8]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_LAMBDA_IDX_P)
            dst->lambda_idx_p = src->lambda_idx_p;

        if (dst->lambda_idx_p < 0 || dst->lambda_idx_p > 8) {
            mpp_err("invalid lambda idx i not in range [0, 8]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_RC_CONTAINER)
            dst->rc_container = src->rc_container;

        if (dst->rc_container < 0 || dst->rc_container > 2) {
            mpp_err("invalid rc_container %d not in range [0, 2]\n", dst->rc_container);
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_VMAF_OPT)
            dst->vmaf_opt = src->vmaf_opt;

        if (dst->vmaf_opt < 0 || dst->vmaf_opt > 1) {
            mpp_err("invalid vmaf_opt %d not in range [0, 1]\n", dst->vmaf_opt);
            ret = MPP_ERR_VALUE;
        }

        dst->change |= change;

        if (ret) {
            mpp_err_f("failed to accept new tuning config\n");
            *dst = bak;
        }
    }

    return ret;
}